

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::PushAttribute(XMLPrinter *this,char *name,char *value)

{
  size_t sVar1;
  
  (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xf])(this,0x20);
  sVar1 = strlen(name);
  (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xe])(this,name,sVar1);
  (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xe])(this,"=\"",2);
  PrintString(this,value,false);
  (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xf])(this,0x22);
  return;
}

Assistant:

void XMLPrinter::PushAttribute( const char* name, const char* value )
{
    TIXMLASSERT( _elementJustOpened );
    Putc ( ' ' );
    Write( name );
    Write( "=\"" );
    PrintString( value, false );
    Putc ( '\"' );
}